

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int exprCodeVector(Parse *pParse,Expr *p,int *piFreeable)

{
  uint uVar1;
  int iVar2;
  int target;
  ulong uVar3;
  ulong uVar4;
  
  uVar1 = sqlite3ExprVectorSize(p);
  if (uVar1 == 1) {
    iVar2 = sqlite3ExprCodeTemp(pParse,p,piFreeable);
    return iVar2;
  }
  *piFreeable = 0;
  if (p->op == 0x83) {
    iVar2 = sqlite3CodeSubselect(pParse,p);
    return iVar2;
  }
  iVar2 = pParse->nMem + 1;
  pParse->nMem = pParse->nMem + uVar1;
  uVar3 = 0;
  uVar4 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar4 = uVar3;
  }
  target = iVar2;
  for (; uVar4 * 0x20 != uVar3; uVar3 = uVar3 + 0x20) {
    sqlite3ExprCodeFactorable(pParse,*(Expr **)((long)&((p->x).pList)->a[0].pExpr + uVar3),target);
    target = target + 1;
  }
  return iVar2;
}

Assistant:

static int exprCodeVector(Parse *pParse, Expr *p, int *piFreeable){
  int iResult;
  int nResult = sqlite3ExprVectorSize(p);
  if( nResult==1 ){
    iResult = sqlite3ExprCodeTemp(pParse, p, piFreeable);
  }else{
    *piFreeable = 0;
    if( p->op==TK_SELECT ){
#if SQLITE_OMIT_SUBQUERY
      iResult = 0;
#else
      iResult = sqlite3CodeSubselect(pParse, p);
#endif
    }else{
      int i;
      iResult = pParse->nMem+1;
      pParse->nMem += nResult;
      for(i=0; i<nResult; i++){
        sqlite3ExprCodeFactorable(pParse, p->x.pList->a[i].pExpr, i+iResult);
      }
    }
  }
  return iResult;
}